

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
          (Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           *this,size_t count)

{
  int32_t *piVar1;
  HookCommonContext **__s;
  FreeFunc *pFVar2;
  Hdr *pHVar3;
  size_t sVar4;
  EVP_PKEY_CTX *dst;
  ulong uVar5;
  HookCommonContext **ppHVar6;
  Ret *pRVar7;
  Hdr *pHVar8;
  HookCommonContext **ppHVar9;
  Hdr *pHVar10;
  long lVar11;
  Ret *pRVar12;
  Ret *pRVar13;
  bool bVar14;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> local_38;
  
  pHVar8 = (this->
           super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           ).m_hdr;
  if ((pHVar8 != (Hdr *)0x0) && ((pHVar8->super_BufHdr).super_RefCount.m_refCount == 1)) {
    uVar5 = (this->
            super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            ).m_count;
    if (count == uVar5) {
      return true;
    }
    if (count * 0x10 <= (pHVar8->super_BufHdr).m_bufferSize) {
      lVar11 = count - uVar5;
      if ((uVar5 <= count && lVar11 != 0) && (0 < lVar11)) {
        pRVar13 = (this->
                  super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                  ).m_p;
        pRVar7 = pRVar13 + uVar5;
        pRVar13 = pRVar13 + uVar5 + 1;
        pRVar12 = pRVar7 + lVar11;
        if (pRVar7 + lVar11 <= pRVar13) {
          pRVar12 = pRVar13;
        }
        memset(pRVar7,0,((long)&pRVar12->m_context + ~(ulong)pRVar7 & 0xfffffffffffffff0) + 0x10);
        pHVar8 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_hdr;
      }
      pHVar8->m_count = count;
      (this->
      super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
      ).m_count = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
    release(&this->
             super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           );
  }
  else {
    if ((this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_count != 0) {
      sVar4 = getAllocSize<4096ul>(count * 0x10);
      dst = (EVP_PKEY_CTX *)operator_new(sVar4 + 0x30,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(size_t *)(dst + 0x18) = sVar4;
      *(undefined8 *)(dst + 0x20) = 0;
      *(undefined ***)dst = &PTR__Hdr_0019e078;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::copy(&local_38,dst,dst);
      bVar14 = local_38.m_p != (Hdr *)0x0;
      if (bVar14) {
        (local_38.m_p)->m_count = count;
        pHVar8 = local_38.m_p + 1;
        uVar5 = (this->
                super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                ).m_count;
        if (uVar5 < count) {
          if (0 < (long)uVar5) {
            pRVar7 = (this->
                     super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                     ).m_p;
            pHVar10 = pHVar8;
            do {
              pFVar2 = (FreeFunc *)pRVar7->m_originalRet;
              (pHVar10->super_BufHdr).super_RefCount._vptr_RefCount =
                   (_func_int **)pRVar7->m_context;
              (pHVar10->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
              pHVar10 = (Hdr *)&(pHVar10->super_BufHdr).super_RefCount.m_refCount;
              pRVar7 = pRVar7 + 1;
            } while (pHVar10 < &(pHVar8->super_BufHdr).super_RefCount._vptr_RefCount + uVar5 * 2);
            uVar5 = (this->
                    super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                    ).m_count;
          }
          if (0 < (long)(count - uVar5)) {
            __s = (HookCommonContext **)
                  (&(pHVar8->super_BufHdr).super_RefCount._vptr_RefCount + uVar5 * 2);
            ppHVar6 = (HookCommonContext **)
                      (&(pHVar8->super_BufHdr).super_RefCount.m_refCount + uVar5 * 4);
            ppHVar9 = __s + (count - uVar5) * 2;
            if (__s + (count - uVar5) * 2 <= ppHVar6) {
              ppHVar9 = ppHVar6;
            }
            memset(__s,0,(~(ulong)__s + (long)ppHVar9 & 0xfffffffffffffff0) + 0x10);
          }
        }
        else if (0 < (long)count) {
          pRVar7 = (this->
                   super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                   ).m_p;
          pHVar10 = pHVar8;
          do {
            pFVar2 = (FreeFunc *)pRVar7->m_originalRet;
            (pHVar10->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar7->m_context;
            (pHVar10->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
            pHVar10 = (Hdr *)&(pHVar10->super_BufHdr).super_RefCount.m_refCount;
            pRVar7 = pRVar7 + 1;
          } while (pHVar10 < &(pHVar8->super_BufHdr).super_RefCount._vptr_RefCount + count * 2);
        }
        pHVar10 = (this->
                  super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                  ).m_hdr;
        LOCK();
        piVar1 = &(pHVar10->super_BufHdr).super_RefCount.m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar10->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar10);
          LOCK();
          piVar1 = &(pHVar10->super_BufHdr).super_RefCount.m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar2 = (pHVar10->super_BufHdr).super_RefCount.m_freeFunc, pFVar2 != (FreeFunc *)0x0)
             ) {
            (*pFVar2)(pHVar10);
          }
        }
        pHVar3 = local_38.m_p;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_p = (Ret *)pHVar8;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_hdr = pHVar3;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_count = count;
      }
      rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::clear(&local_38);
      return bVar14;
    }
    bVar14 = reserve(this,count);
    if (!bVar14) {
      return false;
    }
    if (0 < (long)count) {
      pRVar7 = (this->
               super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
               ).m_p;
      pRVar13 = pRVar7 + count;
      if (pRVar7 + count <= pRVar7 + 1) {
        pRVar13 = pRVar7 + 1;
      }
      memset(pRVar7,0,((long)&pRVar13->m_context + ~(ulong)pRVar7 & 0xfffffffffffffff0) + 0x10);
    }
    ((this->
     super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>)
    .m_hdr)->m_count = count;
    (this->
    super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>).
    m_count = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}